

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fFunctionalTests.cpp
# Opt level: O1

int __thiscall
deqp::gles31::Functional::ShaderLibraryTest::init(ShaderLibraryTest *this,EVP_PKEY_CTX *ctx)

{
  Context *pCVar1;
  pointer pcVar2;
  int extraout_EAX;
  long lVar3;
  vector<tcu::TestNode_*,_std::allocator<tcu::TestNode_*>_> children;
  string fileName;
  ShaderLibrary shaderLibrary;
  vector<tcu::TestNode_*,_std::allocator<tcu::TestNode_*>_> local_68;
  long *local_50 [2];
  long local_40 [2];
  ShaderLibrary local_30;
  
  pCVar1 = (this->super_TestCaseGroup).m_context;
  gls::ShaderLibrary::ShaderLibrary
            (&local_30,(this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx,
             pCVar1->m_renderCtx,pCVar1->m_contextInfo);
  pcVar2 = (this->m_filename)._M_dataplus._M_p;
  local_50[0] = local_40;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_50,pcVar2,pcVar2 + (this->m_filename)._M_string_length);
  gls::ShaderLibrary::loadShaderFile(&local_68,&local_30,(char *)local_50[0]);
  if (0 < (int)((ulong)((long)local_68.
                              super__Vector_base<tcu::TestNode_*,_std::allocator<tcu::TestNode_*>_>.
                              _M_impl.super__Vector_impl_data._M_finish -
                       (long)local_68.
                             super__Vector_base<tcu::TestNode_*,_std::allocator<tcu::TestNode_*>_>.
                             _M_impl.super__Vector_impl_data._M_start) >> 3)) {
    lVar3 = 0;
    do {
      tcu::TestNode::addChild
                ((TestNode *)this,
                 local_68.super__Vector_base<tcu::TestNode_*,_std::allocator<tcu::TestNode_*>_>.
                 _M_impl.super__Vector_impl_data._M_start[lVar3]);
      lVar3 = lVar3 + 1;
    } while (lVar3 < (int)((ulong)((long)local_68.
                                         super__Vector_base<tcu::TestNode_*,_std::allocator<tcu::TestNode_*>_>
                                         ._M_impl.super__Vector_impl_data._M_finish -
                                  (long)local_68.
                                        super__Vector_base<tcu::TestNode_*,_std::allocator<tcu::TestNode_*>_>
                                        ._M_impl.super__Vector_impl_data._M_start) >> 3));
  }
  if (local_68.super__Vector_base<tcu::TestNode_*,_std::allocator<tcu::TestNode_*>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_68.super__Vector_base<tcu::TestNode_*,_std::allocator<tcu::TestNode_*>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_68.
                          super__Vector_base<tcu::TestNode_*,_std::allocator<tcu::TestNode_*>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_68.
                          super__Vector_base<tcu::TestNode_*,_std::allocator<tcu::TestNode_*>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  if (local_50[0] != local_40) {
    operator_delete(local_50[0],local_40[0] + 1);
  }
  gls::ShaderLibrary::~ShaderLibrary(&local_30);
  return extraout_EAX;
}

Assistant:

void init (void)
	{
		gls::ShaderLibrary			shaderLibrary(m_testCtx, m_context.getRenderContext(), m_context.getContextInfo());
		std::string					fileName	= m_filename;
		std::vector<tcu::TestNode*>	children	= shaderLibrary.loadShaderFile(fileName.c_str());

		for (int i = 0; i < (int)children.size(); i++)
			addChild(children[i]);
	}